

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxUniformBlocksTest::~GeometryShaderMaxUniformBlocksTest
          (GeometryShaderMaxUniformBlocksTest *this)

{
  (this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__GeometryShaderMaxUniformBlocksTest_01df8238;
  std::
  _Vector_base<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
  ::~_Vector_base(&(this->m_uniform_blocks).
                   super__Vector_base<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
                 );
  std::__cxx11::string::~string((string *)&this->m_max_uniform_blocks_string);
  std::__cxx11::string::~string((string *)&this->m_uniform_block_access_string);
  TestCaseBase::~TestCaseBase((TestCaseBase *)this);
  return;
}

Assistant:

virtual ~GeometryShaderMaxUniformBlocksTest()
	{
	}